

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

char * skip_identifier(char *str)

{
  char *pcVar1;
  ushort **ppuVar2;
  
  ppuVar2 = __ctype_b_loc();
  if (((long)*str == 0x5f) || (((*ppuVar2)[*str] & 0x400) != 0)) {
    do {
      do {
        pcVar1 = str + 1;
        str = str + 1;
      } while ((long)*pcVar1 == 0x5f);
    } while (((*ppuVar2)[*pcVar1] & 8) != 0);
  }
  else {
    str = (char *)0x0;
  }
  return str;
}

Assistant:

static const char* skip_identifier(const char* str)
{
    if(!isalpha(*str) && *str != '_')
        return NULL;
    else
    {
        ++str;
        for(; isalnum(*str) || *str == '_'; ++str) ;
        return str;
    }
}